

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.c++
# Opt level: O3

String * capnp::_::enumString
                   (String *__return_storage_ptr__,uint16_t value,RawBrandedSchema *schema)

{
  unsigned_short *params;
  uint index;
  undefined6 in_register_00000032;
  bool bVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  Reader RVar4;
  EnumerantList enumerants;
  uint16_t local_ba;
  PointerReader local_b8;
  Schema local_98;
  uint16_t local_90;
  StructReader local_88;
  EnumerantList local_58;
  
  local_ba = value;
  local_b8.segment = (SegmentReader *)schema;
  local_98.raw = (RawBrandedSchema *)Schema::asEnum((Schema *)&local_b8);
  EnumSchema::getEnumerants(&local_58,(EnumSchema *)&local_98);
  index = (uint)CONCAT62(in_register_00000032,value);
  if (index < local_58.list.reader.elementCount) {
    ListReader::getStructElement(&local_88,&local_58.list.reader,index);
    local_98 = local_58.parent.super_Schema.raw;
    bVar1 = local_88.pointerCount == 0;
    local_b8.pointer = local_88.pointers;
    if (bVar1) {
      local_b8.pointer = (WirePointer *)0x0;
    }
    local_b8.nestingLimit = 0x7fffffff;
    if (!bVar1) {
      local_b8.nestingLimit = local_88.nestingLimit;
    }
    uVar2 = 0;
    uVar3 = 0;
    local_b8.capTable._0_4_ = 0;
    local_b8.capTable._4_4_ = 0;
    if (!bVar1) {
      uVar2 = local_88.segment._0_4_;
      uVar3 = local_88.segment._4_4_;
      local_b8.capTable._0_4_ = local_88.capTable._0_4_;
      local_b8.capTable._4_4_ = local_88.capTable._4_4_;
    }
    local_b8.segment = (SegmentReader *)CONCAT44(uVar3,uVar2);
    local_90 = value;
    RVar4 = PointerReader::getBlob<capnp::Text>(&local_b8,(void *)0x0,0);
    kj::heapString(__return_storage_ptr__,RVar4.super_StringPtr.content.ptr,
                   RVar4.super_StringPtr.content.size_ - 1);
  }
  else {
    kj::str<unsigned_short&>(__return_storage_ptr__,(kj *)&local_ba,params);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::String enumString(uint16_t value, const RawBrandedSchema& schema) {
  auto enumerants = Schema(&schema).asEnum().getEnumerants();
  if (value < enumerants.size()) {
    return kj::heapString(enumerants[value].getProto().getName());
  } else {
    return kj::str(value);
  }
}